

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_970_pmu_sup(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x319].name == (char *)0x0) && (env->spr[0x319] == 0)) &&
      (env->spr_cb[0x319].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x319].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x319].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x319].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x319].name = "PMC7";
    env->spr_cb[0x319].uea_read = spr_noaccess;
    env->spr_cb[0x319].uea_write = spr_noaccess;
    env->spr_cb[0x319].oea_read = spr_read_generic;
    env->spr_cb[0x319].oea_write = spr_write_generic;
    env->spr_cb[0x319].hea_read = spr_read_generic;
    env->spr_cb[0x319].hea_write = spr_write_generic;
    env->spr_cb[0x319].default_value = 0;
    env->spr[0x319] = 0;
    if (((env->spr_cb[0x31a].name == (char *)0x0) && (env->spr[0x31a] == 0)) &&
       ((env->spr_cb[0x31a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x31a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x31a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x31a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x31a].name = "PMC8";
      env->spr_cb[0x31a].uea_read = spr_noaccess;
      env->spr_cb[0x31a].uea_write = spr_noaccess;
      env->spr_cb[0x31a].oea_read = spr_read_generic;
      env->spr_cb[0x31a].oea_write = spr_write_generic;
      env->spr_cb[0x31a].hea_read = spr_read_generic;
      env->spr_cb[0x31a].hea_write = spr_write_generic;
      env->spr_cb[0x31a].default_value = 0;
      env->spr[0x31a] = 0;
      return;
    }
    uVar2 = 0x31a;
    uVar1 = 0x31a;
  }
  else {
    uVar2 = 0x319;
    uVar1 = 0x319;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_970_pmu_sup(CPUPPCState *env)
{
    spr_register_kvm(env, SPR_970_PMC7, "PMC7",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_PMC7, 0x00000000);
    spr_register_kvm(env, SPR_970_PMC8, "PMC8",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_PMC8, 0x00000000);
}